

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClockTime.cpp
# Opt level: O3

KString * __thiscall
KDIS::DATA_TYPE::ClockTime::GetAsString_abi_cxx11_(KString *__return_storage_ptr__,ClockTime *this)

{
  ostream *poVar1;
  KStringStream ss;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Hour:             ",0x12);
  poVar1 = (ostream *)std::ostream::operator<<(local_190,this->m_i32Hour);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Time Past Hour:   ",0x12);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString ClockTime::GetAsString() const
{
    KStringStream ss;

    ss << "Hour:             " << m_i32Hour          << "\n"
       << "Time Past Hour:   " << m_ui32TimePastHour << "\n";

    return ss.str();
}